

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall
Assimp::ASE::Parser::ParseLV4MeshBonesVertices(Parser *this,uint iNumVertices,Mesh *mesh)

{
  vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *this_00;
  iterator __position;
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  byte *c;
  pair<int,_float> pairOut;
  ai_real afVert [3];
  pair<int,_float> local_50;
  ulong local_48;
  ai_real aaStack_3c [3];
  
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::resize
            (&mesh->mBoneVertices,(ulong)iNumVertices);
  c = (byte *)this->filePtr;
  local_48 = 0;
  do {
    bVar5 = *c;
    if (bVar5 == 0x2a) {
      while( true ) {
        pbVar3 = c + 1;
        this->filePtr = (char *)pbVar3;
        iVar2 = strncmp("MESH_BONE_VERTEX",(char *)pbVar3,0x10);
        if (iVar2 != 0) break;
        bVar5 = c[0x11];
        if ((0x20 < (ulong)bVar5) || ((0x100003601U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) break;
        pbVar3 = c + 0x12;
        if (bVar5 == 0) {
          pbVar3 = c + 0x11;
        }
        this->filePtr = (char *)pbVar3;
        bVar5 = c[0x12 - (ulong)(bVar5 == 0)];
        uVar6 = 0;
        if (0xf5 < (byte)(bVar5 - 0x3a)) {
          uVar6 = 0;
          do {
            uVar6 = (uint)(byte)(bVar5 - 0x30) + uVar6 * 10;
            bVar5 = pbVar3[1];
            pbVar3 = pbVar3 + 1;
          } while (0xf5 < (byte)(bVar5 - 0x3a));
        }
        this->filePtr = (char *)pbVar3;
        uVar7 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        if (uVar7 < uVar6 || uVar7 - uVar6 == 0) {
          uVar6 = (int)uVar7 - 1;
          LogWarning(this,
                     "Bone vertex index is out of bounds. Using the largest valid bone vertex index instead"
                    );
        }
        lVar8 = 0;
        do {
          ParseLV4MeshFloat(this,(ai_real *)((long)aaStack_3c + lVar8));
          lVar8 = lVar8 + 4;
        } while (lVar8 != 0xc);
        local_50.first = 0;
        local_50.second = 0.0;
        while( true ) {
          for (c = (byte *)this->filePtr; (*c == 0x20 || (*c == 9)); c = c + 1) {
          }
          this->filePtr = (char *)c;
          bVar5 = *c;
          if ((bVar5 < 0xe) && ((0x3401U >> (bVar5 & 0x1f) & 1) != 0)) break;
          iVar2 = 0;
          if (0xf5 < (byte)(bVar5 - 0x3a)) {
            iVar2 = 0;
            do {
              iVar2 = (uint)(byte)(bVar5 - 0x30) + iVar2 * 10;
              bVar5 = c[1];
              c = c + 1;
            } while (0xf5 < (byte)(bVar5 - 0x3a));
          }
          this->filePtr = (char *)c;
          local_50.first = iVar2;
          for (; (*c == 0x20 || (*c == 9)); c = c + 1) {
          }
          this->filePtr = (char *)c;
          if ((*c < 0xe) && ((0x3401U >> (*c & 0x1f) & 1) != 0)) break;
          pcVar4 = fast_atoreal_move<float>((char *)c,&local_50.second,true);
          this->filePtr = pcVar4;
          if (local_50.first != -1) {
            this_00 = (vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)
                      ((mesh->mBoneVertices).
                       super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar6);
            __position._M_current = *(pair<int,_float> **)(this_00 + 8);
            if (__position._M_current == *(pair<int,_float> **)(this_00 + 0x10)) {
              std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
              _M_realloc_insert<std::pair<int,float>const&>(this_00,__position,&local_50);
            }
            else {
              *__position._M_current = local_50;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
            }
          }
        }
        pbVar3 = c;
        if (*c != 0x2a) break;
      }
      c = pbVar3;
      bVar5 = *c;
    }
    bVar1 = false;
    if (bVar5 < 0x7b) {
      if ((bVar5 - 0xc < 2) || (bVar5 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_00396b4b;
        this->iLineNumber = this->iLineNumber + 1;
        bVar1 = true;
      }
      else if (bVar5 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_BONE_VERTEX chunk (Level 4)"
                );
      }
    }
    else {
      if (bVar5 == 0x7d) {
        uVar6 = (int)local_48 - 1;
        if (uVar6 == 0) {
          this->filePtr = (char *)(c + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar5 != 0x7b) goto LAB_00396b4d;
        uVar6 = (int)local_48 + 1;
      }
      local_48 = (ulong)uVar6;
LAB_00396b4b:
      bVar1 = false;
    }
LAB_00396b4d:
    this->bLastWasEndLine = bVar1;
    c = c + 1;
    this->filePtr = (char *)c;
  } while( true );
}

Assistant:

void Parser::ParseLV4MeshBonesVertices(unsigned int iNumVertices,ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    mesh.mBoneVertices.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Mesh bone vertex
            if (TokenMatch(filePtr,"MESH_BONE_VERTEX" ,16))
            {
                // read the vertex index
                unsigned int iIndex = strtoul10(filePtr,&filePtr);
                if (iIndex >= mesh.mPositions.size())
                {
                    iIndex = (unsigned int)mesh.mPositions.size()-1;
                    LogWarning("Bone vertex index is out of bounds. Using the largest valid "
                        "bone vertex index instead");
                }

                // --- ignored
                ai_real afVert[3];
                ParseLV4MeshFloatTriple(afVert);

                std::pair<int,float> pairOut;
                while (true)
                {
                    // first parse the bone index ...
                    if (!SkipSpaces(&filePtr))break;
                    pairOut.first = strtoul10(filePtr,&filePtr);

                    // then parse the vertex weight
                    if (!SkipSpaces(&filePtr))break;
                    filePtr = fast_atoreal_move<float>(filePtr,pairOut.second);

                    // -1 marks unused entries
                    if (-1 != pairOut.first)
                    {
                        mesh.mBoneVertices[iIndex].mBoneWeights.push_back(pairOut);
                    }
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("4","*MESH_BONE_VERTEX");
    }
    return;
}